

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O2

void __thiscall ScopeLocal::collectNameRecs(ScopeLocal *this)

{
  Symbol *this_00;
  _Rb_tree_node_base *p_Var1;
  SymbolEntry *pSVar2;
  Range *pRVar3;
  _Self __tmp;
  _Rb_tree_node_base *p_Var4;
  Address usepoint;
  AddrSpace *local_40;
  uintb uStack_38;
  
  std::
  _Rb_tree<AddressUsePointPair,_std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<AddressUsePointPair>,_std::allocator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->nameRecommend)._M_t);
  std::__cxx11::list<DynamicRecommend,_std::allocator<DynamicRecommend>_>::clear
            (&this->dynRecommend);
  p_Var4 = (this->super_ScopeInternal).nametree._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  while ((_Rb_tree_header *)p_Var4 !=
         &(this->super_ScopeInternal).nametree._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    this_00 = *(Symbol **)(p_Var4 + 1);
    p_Var4 = p_Var1;
    if ((this_00->flags & 0x300) == 0x200) {
      pSVar2 = Symbol::getFirstWholeMap(this_00);
      if (pSVar2 != (SymbolEntry *)0x0) {
        if ((pSVar2->addr).base == (AddrSpace *)0x0) {
          SymbolEntry::getFirstUseAddress((SymbolEntry *)&stack0xffffffffffffffc0);
          addDynamicRecommend(this,(Address *)&stack0xffffffffffffffc0,pSVar2->hash,&this_00->name);
        }
        else {
          local_40 = (AddrSpace *)0x0;
          if ((pSVar2->uselimit).tree._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            pRVar3 = RangeList::getFirstRange(&pSVar2->uselimit);
            local_40 = pRVar3->spc;
            uStack_38 = pRVar3->first;
          }
          addRecommendName(this,&pSVar2->addr,(Address *)&stack0xffffffffffffffc0,&this_00->name,
                           pSVar2->size);
        }
        if (this_00->category < 0) {
          (*(this->super_ScopeInternal).super_Scope._vptr_Scope[0x13])(this,this_00);
        }
      }
    }
  }
  return;
}

Assistant:

void ScopeLocal::collectNameRecs(void)

{
  nameRecommend.clear();	// Clear out any old name recommendations
  dynRecommend.clear();

  SymbolNameTree::iterator iter = nametree.begin();
  while(iter!=nametree.end()) {
    Symbol *sym = *iter++;
    if (sym->isNameLocked()&&(!sym->isTypeLocked())) {
      SymbolEntry *entry = sym->getFirstWholeMap();
      if (entry != (SymbolEntry *)0) {
	if (entry->isDynamic()) {
	  addDynamicRecommend(entry->getFirstUseAddress(), entry->getHash(), sym->getName());
	}
	else {
	  Address usepoint;
	  if (!entry->getUseLimit().empty()) {
	    const Range *range = entry->getUseLimit().getFirstRange();
	    usepoint = Address(range->getSpace(),range->getFirst());
	  }
	  addRecommendName( entry->getAddr(), usepoint, sym->getName(), entry->getSize() );
	}
	if (sym->getCategory()<0)
	  removeSymbol(sym);
      }
    }
  }
}